

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O1

void __thiscall
amrex::algoim::
ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>,_false>
::evalIntegrand(ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  EBPlane *pEVar9;
  GpuArray<double,_3U> x_00;
  uint uVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  byte bVar14;
  int dim_1;
  byte bVar15;
  long lVar16;
  int dim;
  long lVar17;
  double dVar18;
  double dVar19;
  GpuArray<double,_4U> roots;
  double local_78 [2];
  double in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  
  local_78[0] = -0.5;
  pEVar9 = this->phi;
  iVar7 = this->e0;
  dVar11 = (pEVar9->norm).arr[iVar7];
  uVar10 = 1;
  if (((dVar11 != 0.0) || (NAN(dVar11))) && (iVar8 = this->psiCount, 0 < (long)iVar8)) {
    dVar12 = (pEVar9->cent).arr[0];
    dVar1 = (pEVar9->cent).arr[1];
    dVar19 = (pEVar9->norm).arr[0];
    dVar2 = (pEVar9->norm).arr[1];
    dVar3 = (pEVar9->cent).arr[2];
    dVar4 = (pEVar9->norm).arr[2];
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        if ((this->free).arr[lVar17] == false) {
          x.arr[lVar17] =
               *(double *)
                (&DAT_00782480 +
                (ulong)(((this->psi).arr[lVar16].bits >> ((uint)lVar17 & 0x1f) & 1) == 0) * 8);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      x.arr[iVar7] = -0.5;
      dVar18 = -0.5 - ((x.arr[2] - dVar3) * dVar4 +
                      (x.arr[1] - dVar1) * dVar2 + (x.arr[0] - dVar12) * dVar19) / dVar11;
      if (ABS(dVar18) < 0.5) {
        lVar17 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        local_78[lVar17] = dVar18;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar8);
  }
  dVar11 = local_78[1];
  if (uVar10 == 3) {
    if (in_stack_ffffffffffffff98 < local_78[1]) {
      local_78[1] = in_stack_ffffffffffffff98;
      in_stack_ffffffffffffff98 = dVar11;
    }
  }
  local_78[(int)uVar10] = 0.5;
  if (0 < (int)uVar10) {
    dVar11 = (double)(ulong)uVar10;
    dVar12 = 0.0;
    do {
      dVar1 = local_78[(long)dVar12];
      dVar19 = local_78[(long)dVar12 + 1] - dVar1;
      if (1.1102230246251565e-14 <= dVar19) {
        x.arr[this->e0] = (local_78[(long)dVar12 + 1] + dVar1) * 0.5;
        iVar7 = this->psiCount;
        if (0 < (long)iVar7) {
          pEVar9 = this->phi;
          dVar2 = (pEVar9->cent).arr[0];
          dVar3 = (pEVar9->cent).arr[1];
          dVar4 = (pEVar9->norm).arr[0];
          dVar18 = (pEVar9->norm).arr[1];
          dVar5 = (pEVar9->cent).arr[2];
          dVar6 = (pEVar9->norm).arr[2];
          uVar13 = 0;
          do {
            lVar16 = 0;
            do {
              if ((this->free).arr[lVar16] == false) {
                x.arr[lVar16] =
                     *(double *)
                      (&DAT_00782480 +
                      (ulong)(((this->psi).arr[uVar13].bits >> ((uint)lVar16 & 0x1f) & 1) == 0) * 8)
                ;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            bVar14 = ((x.arr[2] - dVar5) * dVar6 +
                      (x.arr[1] - dVar3) * dVar18 + (x.arr[0] - dVar2) * dVar4 <= 0.0) * '\x10';
            bVar15 = (this->psi).arr[uVar13].bits & 0x18;
          } while ((bVar15 != bVar14) && (uVar13 = uVar13 + 1, uVar13 < (ulong)(long)iVar7));
          if (bVar15 == bVar14) goto LAB_0075de43;
        }
        lVar16 = 0;
        do {
          x.arr[this->e0] = *(double *)((long)&DAT_007a6480 + lVar16) * dVar19 + dVar1;
          x_00.arr[1] = (double)in_stack_ffffffffffffffa0;
          x_00.arr[0] = in_stack_ffffffffffffff98;
          x_00.arr[2] = dVar11;
          ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>::
          evalIntegrand(this->f,x_00,*(double *)((long)&DAT_007a64a0 + lVar16) * dVar19 * w);
          lVar16 = lVar16 + 8;
        } while (lVar16 != 0x20);
      }
LAB_0075de43:
      dVar12 = (double)((long)dVar12 + 1);
    } while (dVar12 != dVar11);
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }